

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O1

void UCNV_TO_U_CALLBACK_ESCAPE_63
               (void *context,UConverterToUnicodeArgs *toArgs,char *codeUnits,int32_t length,
               UConverterCallbackReason reason,UErrorCode *err)

{
  byte *pbVar1;
  char cVar2;
  int32_t iVar3;
  int iVar4;
  ulong uVar5;
  int length_00;
  long lVar6;
  UChar *buffer;
  UChar uniValueString [48];
  UChar local_98 [52];
  
  if (2 < (int)reason) {
    return;
  }
  if (context == (void *)0x0) {
    if (0 < length) {
      uVar5 = 0;
      length_00 = 0;
      do {
        (local_98 + length_00)[0] = L'%';
        (local_98 + length_00)[1] = L'X';
        pbVar1 = (byte *)(codeUnits + uVar5);
        uVar5 = uVar5 + 1;
        iVar3 = uprv_itou_63(local_98 + (long)length_00 + 2,0x2e - length_00,(uint)*pbVar1,0x10,2);
        length_00 = length_00 + iVar3 + 2;
      } while ((uint)length != uVar5);
      goto LAB_0033a084;
    }
  }
  else {
    cVar2 = *context;
    if (cVar2 == 'X') {
      if (0 < length) {
        uVar5 = 0;
        length_00 = 0;
        do {
          (local_98 + length_00)[0] = L'&';
          (local_98 + length_00)[1] = L'#';
          local_98[(long)length_00 + 2] = L'x';
          pbVar1 = (byte *)(codeUnits + uVar5);
          uVar5 = uVar5 + 1;
          iVar3 = uprv_itou_63(local_98 + (long)length_00 + 3,0x2d - length_00,(uint)*pbVar1,0x10,0)
          ;
          iVar4 = length_00 + iVar3;
          length_00 = length_00 + iVar3 + 4;
          local_98[iVar4 + 3] = L';';
        } while ((uint)length != uVar5);
        goto LAB_0033a084;
      }
    }
    else if (cVar2 == 'D') {
      if (0 < length) {
        uVar5 = 0;
        length_00 = 0;
        do {
          (local_98 + length_00)[0] = L'&';
          (local_98 + length_00)[1] = L'#';
          pbVar1 = (byte *)(codeUnits + uVar5);
          uVar5 = uVar5 + 1;
          iVar3 = uprv_itou_63(local_98 + (long)length_00 + 2,0x2e - length_00,(uint)*pbVar1,10,0);
          iVar4 = length_00 + iVar3;
          length_00 = length_00 + iVar3 + 3;
          local_98[iVar4 + 2] = L';';
        } while ((uint)length != uVar5);
        goto LAB_0033a084;
      }
    }
    else if (cVar2 == 'C') {
      if (0 < length) {
        uVar5 = 0;
        length_00 = 0;
        do {
          (local_98 + length_00)[0] = L'\\';
          (local_98 + length_00)[1] = L'x';
          pbVar1 = (byte *)(codeUnits + uVar5);
          uVar5 = uVar5 + 1;
          iVar3 = uprv_itou_63(local_98 + (long)length_00 + 2,0x2e - length_00,(uint)*pbVar1,0x10,2)
          ;
          length_00 = length_00 + iVar3 + 2;
        } while ((uint)length != uVar5);
        goto LAB_0033a084;
      }
    }
    else if (0 < length) {
      buffer = local_98 + 2;
      lVar6 = 0;
      do {
        buffer[-2] = L'%';
        buffer[-1] = L'X';
        uprv_itou_63(buffer,(int)lVar6 + 0x2e,(uint)(byte)*codeUnits,0x10,2);
        lVar6 = lVar6 + -4;
        buffer = buffer + 4;
        codeUnits = (char *)((byte *)codeUnits + 1);
      } while ((ulong)(uint)length * 4 + lVar6 != 0);
      length_00 = -(int)lVar6;
      goto LAB_0033a084;
    }
  }
  length_00 = 0;
LAB_0033a084:
  *err = U_ZERO_ERROR;
  ucnv_cbToUWriteUChars_63(toArgs,local_98,length_00,0,err);
  return;
}

Assistant:

U_CAPI void   U_EXPORT2
UCNV_TO_U_CALLBACK_ESCAPE (
                 const void *context,
                 UConverterToUnicodeArgs *toArgs,
                 const char* codeUnits,
                 int32_t length,
                 UConverterCallbackReason reason,
                 UErrorCode * err)
{
    UChar uniValueString[VALUE_STRING_LENGTH];
    int32_t valueStringLength = 0;
    int32_t i = 0;

    if (reason > UCNV_IRREGULAR)
    {
        return;
    }

    if(context==NULL)
    {    
        while (i < length)
        {
            uniValueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT; /* adding % */
            uniValueString[valueStringLength++] = (UChar) UNICODE_X_CODEPOINT;    /* adding X */
            valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t) codeUnits[i++], 16, 2);
        }
    }
    else
    {
        switch(*((char*)context))
        {
        case UCNV_PRV_ESCAPE_XML_DEC:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
                uniValueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
                valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t)codeUnits[i++], 10, 0);
                uniValueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
            }
            break;

        case UCNV_PRV_ESCAPE_XML_HEX:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_AMP_CODEPOINT;   /* adding & */
                uniValueString[valueStringLength++] = (UChar) UNICODE_HASH_CODEPOINT;  /* adding # */
                uniValueString[valueStringLength++] = (UChar) UNICODE_X_LOW_CODEPOINT; /* adding x */
                valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t)codeUnits[i++], 16, 0);
                uniValueString[valueStringLength++] = (UChar) UNICODE_SEMICOLON_CODEPOINT; /* adding ; */
            }
            break;
        case UCNV_PRV_ESCAPE_C:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_RS_CODEPOINT;    /* adding \ */
                uniValueString[valueStringLength++] = (UChar) UNICODE_X_LOW_CODEPOINT; /* adding x */
                valueStringLength += uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t)codeUnits[i++], 16, 2);
            }
            break;
        default:
            while (i < length)
            {
                uniValueString[valueStringLength++] = (UChar) UNICODE_PERCENT_SIGN_CODEPOINT; /* adding % */
                uniValueString[valueStringLength++] = (UChar) UNICODE_X_CODEPOINT;    /* adding X */
                uprv_itou (uniValueString + valueStringLength, VALUE_STRING_LENGTH - valueStringLength, (uint8_t) codeUnits[i++], 16, 2);
                valueStringLength += 2;
            }
        }
    }
    /* reset the error */
    *err = U_ZERO_ERROR;

    ucnv_cbToUWriteUChars(toArgs, uniValueString, valueStringLength, 0, err);
}